

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaAnalytic_mels.c
# Opt level: O3

void analytical_solution(sunrealtype t,N_Vector y,N_Vector yp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  dVar1 = exp(t);
  **(double **)((long)y->content + 0x10) = dVar1;
  dVar1 = exp(t);
  dVar3 = t + -2.0;
  *(double *)(*(long *)((long)y->content + 0x10) + 8) = dVar1 / dVar3;
  dVar1 = exp(t);
  **(double **)((long)yp->content + 0x10) = dVar1;
  dVar1 = exp(t);
  dVar2 = exp(t);
  auVar4._8_8_ = dVar2 / dVar3;
  auVar4._0_8_ = dVar1;
  auVar5._8_8_ = dVar3;
  auVar5._0_8_ = dVar3;
  auVar5 = divpd(auVar4,auVar5);
  *(double *)(*(long *)((long)yp->content + 0x10) + 8) = auVar5._0_8_ - auVar5._8_8_;
  return;
}

Assistant:

static void analytical_solution(sunrealtype t, N_Vector y, N_Vector yp)
{
  NV_Ith_S(y, 0)  = SUNRexp(t);
  NV_Ith_S(y, 1)  = SUNRexp(t) / (t - SUN_RCONST(2.0));
  NV_Ith_S(yp, 0) = SUNRexp(t);
  NV_Ith_S(yp, 1) = SUNRexp(t) / (t - SUN_RCONST(2.0)) -
                    SUNRexp(t) / (t - SUN_RCONST(2.0)) / (t - SUN_RCONST(2.0));
}